

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O2

DdNode * Llb_CoreComputeCube(DdManager *dd,Vec_Int_t *vVars,int fUseVarIndex,char *pValues)

{
  abctime aVar1;
  int iVar2;
  DdNode *n;
  DdNode *pDVar3;
  ulong uVar4;
  int i;
  long lVar5;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  n = Cudd_ReadOne(dd);
  Cudd_Ref(n);
  for (lVar5 = 0; lVar5 < vVars->nSize; lVar5 = lVar5 + 1) {
    iVar2 = Vec_IntEntry(vVars,(int)lVar5);
    i = (int)lVar5;
    if (fUseVarIndex != 0) {
      i = iVar2;
    }
    pDVar3 = Cudd_bddIthVar(dd,i);
    uVar4 = 1;
    if (pValues != (char *)0x0) {
      uVar4 = (ulong)(pValues[lVar5] != '\x01');
    }
    pDVar3 = Cudd_bddAnd(dd,n,(DdNode *)(uVar4 ^ (ulong)pDVar3));
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,n);
    n = pDVar3;
  }
  Cudd_Deref(n);
  dd->TimeStop = aVar1;
  return n;
}

Assistant:

DdNode * Llb_CoreComputeCube( DdManager * dd, Vec_Int_t * vVars, int fUseVarIndex, char * pValues )
{
    DdNode * bRes, * bVar, * bTemp;
    int i, iVar, Index;
    abctime TimeStop;
    TimeStop = dd->TimeStop; dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Vec_IntForEachEntry( vVars, Index, i )
    {
        iVar  = fUseVarIndex ? Index : i;
        bVar  = Cudd_NotCond( Cudd_bddIthVar(dd, iVar), (int)(pValues == NULL || pValues[i] != 1) );
        bRes  = Cudd_bddAnd( dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return bRes;
}